

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

int __thiscall
chaiscript::detail::Any::Data_Impl<std::shared_ptr<chaiscript::Type_Info>_>::clone
          (Data_Impl<std::shared_ptr<chaiscript::Type_Info>_> *this,__fn *__fn,void *__child_stack,
          int __flags,void *__arg,...)

{
  shared_ptr<chaiscript::Type_Info> local_20;
  Data_Impl<std::shared_ptr<chaiscript::Type_Info>_> *this_local;
  
  local_20.super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  this_local = this;
  std::
  make_unique<chaiscript::detail::Any::Data_Impl<std::shared_ptr<chaiscript::Type_Info>>,std::shared_ptr<chaiscript::Type_Info>const&>
            (&local_20);
  std::unique_ptr<chaiscript::detail::Any::Data,std::default_delete<chaiscript::detail::Any::Data>>
  ::
  unique_ptr<chaiscript::detail::Any::Data_Impl<std::shared_ptr<chaiscript::Type_Info>>,std::default_delete<chaiscript::detail::Any::Data_Impl<std::shared_ptr<chaiscript::Type_Info>>>,void>
            ((unique_ptr<chaiscript::detail::Any::Data,std::default_delete<chaiscript::detail::Any::Data>>
              *)this,(unique_ptr<chaiscript::detail::Any::Data_Impl<std::shared_ptr<chaiscript::Type_Info>_>,_std::default_delete<chaiscript::detail::Any::Data_Impl<std::shared_ptr<chaiscript::Type_Info>_>_>_>
                      *)&local_20);
  std::
  unique_ptr<chaiscript::detail::Any::Data_Impl<std::shared_ptr<chaiscript::Type_Info>_>,_std::default_delete<chaiscript::detail::Any::Data_Impl<std::shared_ptr<chaiscript::Type_Info>_>_>_>
  ::~unique_ptr((unique_ptr<chaiscript::detail::Any::Data_Impl<std::shared_ptr<chaiscript::Type_Info>_>,_std::default_delete<chaiscript::detail::Any::Data_Impl<std::shared_ptr<chaiscript::Type_Info>_>_>_>
                 *)&local_20);
  return (int)this;
}

Assistant:

std::unique_ptr<Data> clone() const override { return std::make_unique<Data_Impl<T>>(m_data); }